

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavesplit.cpp
# Opt level: O3

CommandOptions * wav_file_info(CommandOptions *Options)

{
  int iVar1;
  FILE *__stream;
  long in_RSI;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Rational PictureRate;
  WAVParser Parser;
  AudioDescriptor ADesc;
  allocator<char> local_f1;
  Rational local_f0;
  Rational local_e8 [2];
  long *local_d8 [2];
  long local_c8 [2];
  AudioDescriptor local_b8;
  AudioDescriptor local_88 [2];
  
  local_b8.EditRate.Numerator = 0;
  local_b8.EditRate.Denominator = 0;
  local_b8.AudioSamplingRate.Numerator = 0;
  local_b8.AudioSamplingRate.Denominator = 0;
  local_f0 = ASDCP::EditRate_24;
  ASDCP::PCM::WAVParser::WAVParser((WAVParser *)local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d8,*(char **)(in_RSI + 0x18),&local_f1);
  ASDCP::PCM::WAVParser::OpenRead((string *)Options,local_e8);
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  iVar1._0_1_ = Options->error_flag;
  iVar1._1_1_ = Options->create_flag;
  iVar1._2_1_ = Options->info_flag;
  iVar1._3_1_ = Options->version_flag;
  if (-1 < iVar1) {
    ASDCP::PCM::WAVParser::FillAudioDescriptor(local_88);
    Kumu::Result_t::~Result_t((Result_t *)local_88);
    __stream = _stderr;
    local_b8.EditRate = local_f0;
    auVar3._0_8_ = (double)local_b8.AudioSamplingRate.Numerator;
    auVar3._8_8_ = (double)local_f0.Numerator;
    auVar4._0_8_ = (double)local_b8.AudioSamplingRate.Denominator;
    auVar4._8_8_ = (double)local_f0.Denominator;
    auVar3 = divpd(auVar3,auVar4);
    dVar2 = ceil(auVar3._0_8_ / auVar3._8_8_);
    fprintf(__stream,"48Khz PCM Audio, %s fps (%u spf)\n","24",(long)dVar2);
    fputs("AudioDescriptor:\n",_stderr);
    ASDCP::PCM::AudioDescriptorDump(&local_b8,(_IO_FILE *)0x0);
  }
  ASDCP::PCM::WAVParser::~WAVParser((WAVParser *)local_e8);
  return Options;
}

Assistant:

Result_t
wav_file_info(CommandOptions& Options)
{
  PCM::AudioDescriptor ADesc;
  Rational         PictureRate = EditRate_24;
  PCM::WAVParser Parser;

  // set up essence parser
  Result_t result = Parser.OpenRead(Options.filename, PictureRate);

  if ( ASDCP_SUCCESS(result) )
    {
      Parser.FillAudioDescriptor(ADesc);
      ADesc.EditRate = PictureRate;
      fprintf(stderr, "48Khz PCM Audio, %s fps (%u spf)\n", "24",
	      PCM::CalcSamplesPerFrame(ADesc));
      fputs("AudioDescriptor:\n", stderr);
      PCM::AudioDescriptorDump(ADesc);
    }

  return result;
}